

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_dupset(Curl_easy *dst,Curl_easy *src)

{
  CURLcode CVar1;
  size_t length;
  char *pcVar2;
  uint local_28;
  dupstring i;
  CURLcode result;
  Curl_easy *src_local;
  Curl_easy *dst_local;
  
  memcpy(&dst->set,&src->set,0x6b8);
  memset((dst->set).str,0,0x1c0);
  for (local_28 = 0; local_28 < 0x36; local_28 = local_28 + 1) {
    CVar1 = setstropt((dst->set).str + local_28,(src->set).str[local_28]);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  if (((src->set).postfieldsize != 0) && ((src->set).str[0x37] != (char *)0x0)) {
    pcVar2 = (src->set).str[0x37];
    length = curlx_sotouz((src->set).postfieldsize);
    pcVar2 = (char *)Curl_memdup(pcVar2,length);
    (dst->set).str[0x37] = pcVar2;
    if ((dst->set).str[0x37] == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (dst->set).postfields = (dst->set).str[0x37];
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_dupset(struct Curl_easy *dst, struct Curl_easy *src)
{
  CURLcode result = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LASTZEROTERMINATED; i++) {
    result = setstropt(&dst->set.str[i], src->set.str[i]);
    if(result)
      return result;
  }

  /* duplicate memory areas pointed to */
  i = STRING_COPYPOSTFIELDS;
  if(src->set.postfieldsize && src->set.str[i]) {
    /* postfieldsize is curl_off_t, Curl_memdup() takes a size_t ... */
    dst->set.str[i] = Curl_memdup(src->set.str[i],
                                  curlx_sotouz(src->set.postfieldsize));
    if(!dst->set.str[i])
      return CURLE_OUT_OF_MEMORY;
    /* point to the new copy */
    dst->set.postfields = dst->set.str[i];
  }

  return CURLE_OK;
}